

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O3

void __thiscall
booster::aio::basic_socket::set_option
          (basic_socket *this,integer_option_type opt,int v,error_code *e)

{
  error_category *peVar1;
  native_type __fd;
  int iVar2;
  int *piVar3;
  int value;
  undefined1 local_14 [4];
  
  if (opt == receive_buffer_size) {
    iVar2 = 8;
  }
  else {
    if (opt != send_buffer_size) {
      return;
    }
    iVar2 = 7;
  }
  __fd = basic_io_device::native(&this->super_basic_io_device);
  iVar2 = setsockopt(__fd,1,iVar2,local_14,4);
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    peVar1 = syscat;
    e->_M_value = *piVar3;
    e->_M_cat = peVar1;
  }
  return;
}

Assistant:

void basic_socket::set_option(integer_option_type opt,int v,system::error_code &e)
{
	int value = v;
	char const *p=reinterpret_cast<char const *>(&value);
	int res = 0;
	switch(opt) {
	case receive_buffer_size:
		res=::setsockopt(native(),SOL_SOCKET,SO_RCVBUF,p,sizeof(value));
		break;
	case send_buffer_size:
		res=::setsockopt(native(),SOL_SOCKET,SO_SNDBUF,p,sizeof(value));
		break;
	default:
		;
	}
	if(res < 0)
		e=geterror();
}